

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O2

void __thiscall miniros::TransportTCP::socketUpdate(TransportTCP *this,int events)

{
  recursive_mutex *__mutex;
  uint uVar1;
  Level level;
  void *logger_handle;
  int iVar2;
  char *pcVar3;
  socklen_t *in_RCX;
  sockaddr *__addr;
  allocator<char> local_51;
  TransportTCPPtr transport;
  uint32_t error;
  socklen_t len;
  
  __mutex = &this->close_mutex_;
  std::recursive_mutex::lock(__mutex);
  if (this->closed_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  if (((events & 1U) != 0) && (this->expecting_read_ == true)) {
    if (this->is_server_ == true) {
      accept((TransportTCP *)&transport,(int)this,__addr,in_RCX);
      if (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)>::operator()
                  (&this->accept_cb_,&transport);
      }
    }
    else {
      if ((this->super_Transport).read_cb_.super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0026752b;
      std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Transport,void>
                ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)&transport,
                 (__weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_Transport).super_enable_shared_from_this<miniros::Transport>);
      std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator()
                (&(this->super_Transport).read_cb_,(shared_ptr<miniros::Transport> *)&transport);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
LAB_0026752b:
  if ((((events & 4U) != 0) && (this->expecting_write_ == true)) &&
     ((this->super_Transport).write_cb_.super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::Transport,void>
              ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)&transport,
               (__weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_Transport).super_enable_shared_from_this<miniros::Transport>);
    std::function<void_(const_std::shared_ptr<miniros::Transport>_&)>::operator()
              (&(this->super_Transport).write_cb_,(shared_ptr<miniros::Transport> *)&transport);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((events & 0x2038U) != 0) {
    error = 0xffffffff;
    len = 4;
    iVar2 = getsockopt(this->sock_,1,4,&error,&len);
    if (iVar2 < 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (socketUpdate::loc.initialized_ == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&transport,"miniros.transport_tcp",&local_51);
        console::initializeLogLocation(&socketUpdate::loc,(string *)&transport,Debug);
        std::__cxx11::string::~string((string *)&transport);
      }
      if (socketUpdate::loc.level_ != Debug) {
        console::setLogLocationLevel(&socketUpdate::loc,Debug);
        console::checkLogLocationEnabled(&socketUpdate::loc);
      }
      if (socketUpdate::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,socketUpdate::loc.logger_,socketUpdate::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0x2cd,"void miniros::TransportTCP::socketUpdate(int)",
                       "getsockopt failed on socket [%d]",(ulong)(uint)this->sock_);
      }
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (socketUpdate(int)::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&transport,"miniros.transport_tcp",&local_51);
      console::initializeLogLocation(&socketUpdate(int)::loc,(string *)&transport,Debug);
      std::__cxx11::string::~string((string *)&transport);
    }
    if (socketUpdate(int)::loc.level_ != Debug) {
      console::setLogLocationLevel(&socketUpdate(int)::loc,Debug);
      console::checkLogLocationEnabled(&socketUpdate(int)::loc);
    }
    logger_handle = socketUpdate(int)::loc.logger_;
    level = socketUpdate(int)::loc.level_;
    if (socketUpdate(int)::loc.logger_enabled_ == true) {
      uVar1 = this->sock_;
      pcVar3 = strerror(error);
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0x2d4,"void miniros::TransportTCP::socketUpdate(int)",
                     "Socket %d closed with (ERR|HUP|NVAL) events %d: %s",(ulong)uVar1,
                     (ulong)(uint)events,pcVar3);
    }
    (*(this->super_Transport)._vptr_Transport[8])(this);
  }
  return;
}

Assistant:

void TransportTCP::socketUpdate(int events)
{
  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);
    if (closed_)
    {
      return;
    }

    // Handle read events before err/hup/nval, since there may be data left on the wire
    if ((events & POLLIN) && expecting_read_)
    {
      if (is_server_)
      {
        // Should not block here, because poll() said that it's ready
        // for reading
        TransportTCPPtr transport = accept();
        if (transport)
        {
          MINIROS_ASSERT(accept_cb_);
          accept_cb_(transport);
        }
      }
      else
      {
        if (read_cb_)
        {
          read_cb_(shared_from_this());
        }
      }
    }

    if ((events & POLLOUT) && expecting_write_)
    {
      if (write_cb_)
      {
        write_cb_(shared_from_this());
      }
    }
  }

  if((events & POLLERR) ||
     (events & POLLHUP) ||
#if defined(POLLRDHUP) // POLLRDHUP is not part of POSIX!
     (events & POLLRDHUP) ||
#endif
     (events & POLLNVAL))
  {
    uint32_t error = -1;
    socklen_t len = sizeof(error);
    if (getsockopt(sock_, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&error), &len) < 0)
    {
      MINIROS_DEBUG("getsockopt failed on socket [%d]", sock_);
    }
  #ifdef _MSC_VER
    char err[60];
    strerror_s(err,60,error);
    MINIROS_DEBUG("Socket %d closed with (ERR|HUP|NVAL) events %d: %s", sock_, events, err);
  #else
    MINIROS_DEBUG("Socket %d closed with (ERR|HUP|NVAL) events %d: %s", sock_, events, strerror(error));
  #endif

    close();
  }
}